

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_RecursiveInclude::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  Template *tpl;
  allocator local_f9;
  TemplateString local_f8;
  pointer local_d8;
  size_type sStack_d0;
  undefined1 local_c8;
  uint7 uStack_c7;
  undefined8 uStack_c0;
  string incname;
  TemplateString local_98;
  TemplateDictionary dict;
  
  std::__cxx11::string::string
            ((string *)&dict,"hi {{>INC}} bar\n  {{>INC}}!",(allocator *)&local_f8);
  ctemplate::StringToTemplateFile(&incname,(string *)&dict);
  std::__cxx11::string::~string((string *)&dict);
  _dict = incname._M_dataplus._M_p;
  tpl = (Template *)ctemplate::Template::GetTemplate((TemplateString *)&dict,DO_NOT_STRIP);
  ctemplate::TemplateString::TemplateString(&local_f8,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_f8,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_98,"INC");
  TVar1.length_ = local_98.length_;
  TVar1.ptr_ = local_98.ptr_;
  TVar1.is_immutable_ = local_98.is_immutable_;
  TVar1._17_7_ = local_98._17_7_;
  TVar1.id_ = local_98.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  local_d8 = incname._M_dataplus._M_p;
  sStack_d0 = incname._M_string_length;
  local_c8 = 0;
  uStack_c0 = 0;
  TVar2.length_ = incname._M_string_length;
  TVar2.ptr_ = incname._M_dataplus._M_p;
  TVar2._16_8_ = (ulong)uStack_c7 << 8;
  TVar2.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar2);
  std::__cxx11::string::string
            ((string *)&local_f8,"hi hi  bar\n  ! bar\n  hi  bar\n    !!",&local_f9);
  ctemplate::AssertExpandIs(tpl,&dict,(string *)&local_f8,true);
  std::__cxx11::string::~string((string *)&local_f8);
  ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
  std::__cxx11::string::~string((string *)&incname);
  return;
}

Assistant:

TEST(Template, RecursiveInclude) {
  string incname = StringToTemplateFile("hi {{>INC}} bar\n  {{>INC}}!");
  Template* tpl = Template::GetTemplate(incname, DO_NOT_STRIP);
  TemplateDictionary dict("dict");
  dict.AddIncludeDictionary("INC")->SetFilename(incname);
  // Note the last line is indented 4 spaces instead of 2.  This is
  // because the last sub-include is indented.
  AssertExpandIs(tpl, &dict, "hi hi  bar\n  ! bar\n  hi  bar\n    !!", true);
}